

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

void art_free_node48(art_node48_t *node)

{
  int iVar1;
  art_node_t *node_00;
  long in_RDI;
  uint8_t child_idx;
  uint64_t used_children;
  
  for (node_00 = (art_node_t *)(*(ulong *)(in_RDI + 8) ^ 0xffffffffffff);
      node_00 != (art_node_t *)0x0;
      node_00 = (art_node_t *)((1L << ((byte)iVar1 & 0x3f) ^ 0xffffffffffffffffU) & (ulong)node_00))
  {
    iVar1 = roaring_trailing_zeroes((unsigned_long_long)node_00);
    art_free_node(node_00);
  }
  roaring_free((void *)0x11a899);
  return;
}

Assistant:

static void art_free_node48(art_node48_t *node) {
    uint64_t used_children =
        (node->available_children) ^ NODE48_AVAILABLE_CHILDREN_MASK;
    while (used_children != 0) {
        // We checked above that used_children is not zero
        uint8_t child_idx = roaring_trailing_zeroes(used_children);
        art_free_node(node->children[child_idx]);
        used_children &= ~(UINT64_C(1) << child_idx);
    }
    roaring_free(node);
}